

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void UnpackAccumulativeOffsetsIntoRanges
               (int base_codepoint,short *accumulative_offsets,int accumulative_offsets_count,
               ImWchar *out_ranges)

{
  ulong uVar1;
  short sVar2;
  undefined4 in_register_00000014;
  ulong uVar3;
  undefined4 in_register_0000003c;
  short sVar4;
  
  uVar1 = 0;
  uVar3 = (ulong)accumulative_offsets & 0xffffffff;
  if ((int)accumulative_offsets < 1) {
    uVar3 = uVar1;
  }
  sVar2 = 0x4e00;
  for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    sVar4 = *(short *)(CONCAT44(in_register_0000003c,base_codepoint) + uVar1 * 2) + sVar2;
    *(short *)(CONCAT44(in_register_00000014,accumulative_offsets_count) + 2 + uVar1 * 4) = sVar4;
    *(short *)(CONCAT44(in_register_00000014,accumulative_offsets_count) + uVar1 * 4) = sVar4;
    sVar2 = sVar2 + *(short *)(CONCAT44(in_register_0000003c,base_codepoint) + uVar1 * 2);
  }
  *(undefined2 *)(CONCAT44(in_register_00000014,accumulative_offsets_count) + uVar1 * 4) = 0;
  return;
}

Assistant:

static void UnpackAccumulativeOffsetsIntoRanges(int base_codepoint, const short* accumulative_offsets, int accumulative_offsets_count, ImWchar* out_ranges)
{
    for (int n = 0; n < accumulative_offsets_count; n++, out_ranges += 2)
    {
        out_ranges[0] = out_ranges[1] = (ImWchar)(base_codepoint + accumulative_offsets[n]);
        base_codepoint += accumulative_offsets[n];
    }
    out_ranges[0] = 0;
}